

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

void __thiscall CTcTokenizer::splice_string(CTcTokenizer *this)

{
  byte bVar1;
  int iVar2;
  utf8_ptr uVar3;
  int iVar4;
  wchar_t wVar5;
  int iVar6;
  uint uVar7;
  wchar_t wVar8;
  long lVar9;
  size_t sVar10;
  ulong uVar11;
  char *__n;
  char cVar12;
  utf8_ptr *p;
  byte *p_00;
  uint uVar13;
  char *pcVar14;
  utf8_ptr p_01;
  utf8_ptr local_48;
  uint local_3c;
  CTcTokString *local_38;
  
  uVar11 = (this->linebuf_).buf_len_;
  p_01.p_ = (char *)0x0;
  uVar13 = 0;
  if (1 < uVar11) {
    uVar13 = (uint)(*(short *)((this->linebuf_).buf_ + (uVar11 - 2)) == 0x6e5c);
  }
  wVar8 = this->in_quote_;
  iVar2 = this->in_triple_;
  local_38 = &this->linebuf_;
  local_48.p_ = (char *)0x0;
  do {
    if (this->string_newline_spacing_ == NEWLINE_SPACING_PRESERVE) {
      (*(this->linebuf_)._vptr_CTcTokString[2])(local_38,(this->linebuf_).buf_len_ + 2);
      pcVar14 = (this->linebuf_).buf_ + (this->linebuf_).buf_len_;
      pcVar14[0] = '\\';
      pcVar14[1] = 'n';
      lVar9 = 2;
LAB_0021cca4:
      sVar10 = lVar9 + (this->linebuf_).buf_len_;
      (this->linebuf_).buf_len_ = sVar10;
      (this->linebuf_).buf_[sVar10] = '\0';
    }
    else if ((this->string_newline_spacing_ == NEWLINE_SPACING_COLLAPSE) && (uVar13 == 0)) {
      (*(this->linebuf_)._vptr_CTcTokString[2])(local_38,(this->linebuf_).buf_len_ + 1);
      (this->linebuf_).buf_[(this->linebuf_).buf_len_] = ' ';
      lVar9 = 1;
      goto LAB_0021cca4;
    }
    iVar4 = read_line(this,1);
    if (iVar4 == -1) {
      wVar8 = L'\0';
      goto LAB_0021d082;
    }
    p_01.p_ = (this->linebuf_).buf_ + iVar4;
    p = (utf8_ptr *)p_01.p_;
    uVar3.p_ = local_48.p_;
    if ((this->string_newline_spacing_ != NEWLINE_SPACING_PRESERVE) && (uVar13 == 0)) {
      wVar5 = utf8_ptr::s_getch(p_01.p_);
      while ((uVar3.p_ = (char *)p, (uint)wVar5 < 0x80 && (iVar6 = isspace(wVar5), iVar6 != 0))) {
        p = (utf8_ptr *)
            ((long)&p->p_ +
            (ulong)(((*(byte *)&p->p_ >> 5 & 1) != 0) + 1 & (uint)(*(byte *)&p->p_ >> 7) * 3) + 1);
        wVar5 = utf8_ptr::s_getch((char *)p);
      }
    }
    local_48.p_ = uVar3.p_;
    sVar10 = (this->linebuf_).buf_len_;
    local_3c = 0;
    if (1 < sVar10 - (long)iVar4) {
      local_3c = (uint)(*(short *)((this->linebuf_).buf_ + (sVar10 - 2)) == 0x6e5c);
    }
    if (p_01.p_ < p) {
      pcVar14 = (this->linebuf_).buf_;
      __n = pcVar14 + (sVar10 - (long)p);
      pcVar14 = p_01.p_ + ((long)__n - (long)pcVar14);
      memmove(p_01.p_,p,(size_t)__n);
      (this->linebuf_).buf_len_ = (size_t)pcVar14;
      if (pcVar14 < (char *)(this->linebuf_).buf_size_) {
        (this->linebuf_).buf_[(long)pcVar14] = '\0';
      }
    }
    wVar5 = utf8_ptr::s_getch(p_01.p_);
    if ((wVar5 == L'}') || (wVar5 = utf8_ptr::s_getch(p_01.p_), uVar13 = local_3c, wVar5 == L';')) {
      p_00 = (byte *)((long)&((utf8_ptr *)p_01.p_)->p_ +
                     (ulong)(((*(byte *)&((utf8_ptr *)p_01.p_)->p_ >> 5 & 1) != 0) + 1 &
                            (uint)(*(byte *)&((utf8_ptr *)p_01.p_)->p_ >> 7) * 3) + 1);
      wVar5 = utf8_ptr::s_getch((char *)p_00);
      uVar13 = local_3c;
      while (((uint)wVar5 < 0x80 && (iVar4 = isspace(wVar5), iVar4 != 0))) {
        p_00 = p_00 + (ulong)(((*p_00 >> 5 & 1) != 0) + 1 & (uint)(*p_00 >> 7) * 3) + 1;
        wVar5 = utf8_ptr::s_getch((char *)p_00);
      }
      wVar5 = utf8_ptr::s_getch((char *)p_00);
      if (wVar5 == L'\0') {
        log_error(0x2743,this->appended_linenum_);
        this->in_quote_ = L'\0';
        process_comments(this,(long)p_01.p_ - (long)(this->linebuf_).buf_);
LAB_0021d082:
        cVar12 = (char)wVar8;
        if ((utf8_ptr *)p_01.p_ != (utf8_ptr *)0x0) {
LAB_0021d087:
          unsplice_line(this,p_01.p_);
        }
        if (cVar12 != '\0') {
          (*(this->linebuf_)._vptr_CTcTokString[2])(local_38,(this->linebuf_).buf_len_ + 1);
          (this->linebuf_).buf_[(this->linebuf_).buf_len_] = cVar12;
          sVar10 = (this->linebuf_).buf_len_;
          (this->linebuf_).buf_len_ = sVar10 + 1;
          (this->linebuf_).buf_[sVar10 + 1] = '\0';
        }
        return;
      }
    }
    while( true ) {
      local_48.p_ = p_01.p_;
      wVar5 = utf8_ptr::s_getch(p_01.p_);
      if (wVar5 == L'\\') {
        p_01.p_ = (char *)((long)&((utf8_ptr *)p_01.p_)->p_ +
                          (ulong)(((*(byte *)&((utf8_ptr *)p_01.p_)->p_ >> 5 & 1) != 0) + 1 &
                                 (uint)(*(byte *)&((utf8_ptr *)p_01.p_)->p_ >> 7) * 3) + 1);
        local_48.p_ = p_01.p_;
        if ((iVar2 == 0) || (wVar5 = utf8_ptr::s_getch(p_01.p_), wVar5 != wVar8)) {
          wVar5 = utf8_ptr::s_getch(p_01.p_);
          if (wVar5 == L'<') {
            while (wVar5 = utf8_ptr::s_getch(p_01.p_), wVar5 == L'<') {
              p_01.p_ = (char *)((long)&((utf8_ptr *)p_01.p_)->p_ +
                                (ulong)(((*(byte *)&((utf8_ptr *)p_01.p_)->p_ >> 5 & 1) != 0) + 1 &
                                       (uint)(*(byte *)&((utf8_ptr *)p_01.p_)->p_ >> 7) * 3) + 1);
            }
          }
        }
        else {
          iVar4 = count_quotes((utf8_ptr *)p_01.p_,wVar8);
          if (iVar4 + -1 != 0) {
            lVar9 = (long)(iVar4 + -1);
            do {
              p_01.p_ = (char *)((long)&((utf8_ptr *)p_01.p_)->p_ +
                                (ulong)(((*(byte *)&((utf8_ptr *)p_01.p_)->p_ >> 5 & 1) != 0) + 1 &
                                       (uint)(*(byte *)&((utf8_ptr *)p_01.p_)->p_ >> 7) * 3) + 1);
              lVar9 = lVar9 + -1;
            } while (lVar9 != 0);
          }
        }
        goto LAB_0021cf67;
      }
      if (wVar5 == wVar8) {
        if (iVar2 == 0) {
          cVar12 = '\0';
          p_01.p_ = (char *)((long)&((utf8_ptr *)p_01.p_)->p_ +
                            (ulong)(((*(byte *)&((utf8_ptr *)p_01.p_)->p_ >> 5 & 1) != 0) + 1 &
                                   (uint)(*(byte *)&((utf8_ptr *)p_01.p_)->p_ >> 7) * 3) + 1);
        }
        else {
          uVar7 = count_quotes((utf8_ptr *)p_01.p_,wVar8);
          if ((int)uVar7 < 3) goto LAB_0021cf67;
          uVar11 = (ulong)uVar7;
          cVar12 = '\0';
          do {
            p_01.p_ = (char *)((long)&((utf8_ptr *)p_01.p_)->p_ +
                              (ulong)(((*(byte *)&((utf8_ptr *)p_01.p_)->p_ >> 5 & 1) != 0) + 1 &
                                     (uint)(*(byte *)&((utf8_ptr *)p_01.p_)->p_ >> 7) * 3) + 1);
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
        }
        goto LAB_0021d087;
      }
      if (wVar5 != L'<') break;
      wVar5 = utf8_ptr::s_getch_at(p_01.p_,1);
      if (wVar5 == L'<') {
        cVar12 = '\0';
        uVar11 = (ulong)(((*(byte *)&((utf8_ptr *)p_01.p_)->p_ >> 5 & 1) != 0) + 1 &
                        (uint)(*(byte *)&((utf8_ptr *)p_01.p_)->p_ >> 7) * 3);
        bVar1 = *(byte *)((long)&((utf8_ptr *)p_01.p_)->p_ + uVar11 + 1);
        p_01.p_ = (char *)((long)&((utf8_ptr *)p_01.p_)->p_ +
                          (((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + uVar11 + 2);
        local_48.p_ = p_01.p_;
        wVar8 = utf8_ptr::s_getch(p_01.p_);
        if (wVar8 != L'%') goto LAB_0021d087;
        scan_sprintf_spec(this,&local_48);
        wVar8 = L'\0';
        p_01.p_ = local_48.p_;
        goto LAB_0021d082;
      }
LAB_0021cf67:
      p_01.p_ = (char *)((long)&((utf8_ptr *)p_01.p_)->p_ +
                        (ulong)(((*(byte *)&((utf8_ptr *)p_01.p_)->p_ >> 5 & 1) != 0) + 1 &
                               (uint)(*(byte *)&((utf8_ptr *)p_01.p_)->p_ >> 7) * 3) + 1);
    }
    if (wVar5 != L'\0') goto LAB_0021cf67;
  } while( true );
}

Assistant:

void CTcTokenizer::splice_string()
{
    /* presume we'll find proper termination */
    char unterm = '\0';

    /* 
     *   remember the current in-quote and in-embedding status, as of the
     *   end of the current line - when we splice, the line reader will
     *   update these to the status at the end of the newly-read material,
     *   but we want to scan from the beginning of the newly-read material 
     */
    wchar_t in_quote = in_quote_;
    int in_triple = in_triple_;

    /* note if the previous line ended with an explicit \n sequence */
    int explicit_nl = (linebuf_.get_text_len() >= 2
                       && memcmp(linebuf_.get_text_end() - 2, "\\n", 2) == 0);
        
    /* keep going until we find the end of the string */
    utf8_ptr p((char *)0);
    for (;;)
    {
        /* apply the newline spacing mode */
        switch (string_newline_spacing_)
        {
        case NEWLINE_SPACING_COLLAPSE:
            /* 
             *   Replace the newline and any subsequent run of whitespace
             *   characters with a single space, unless the last line ended
             *   with an explicit newline.
             */
            if (!explicit_nl)
                linebuf_.append(" ", 1);
            break;

        case NEWLINE_SPACING_DELETE:
            /* delete the newline and subsequent whitespace */
            break;

        case NEWLINE_SPACING_PRESERVE:
            /* 
             *   preserve the newline and subsequent whitespace exactly as
             *   written in the source code, so convert the newline to an
             *   explicit \n sequence (in source form, since we're building a
             *   source line at this point)
             */
            linebuf_.append("\\n", 2);
            break;
        }

        /* splice another line */
        int new_line_ofs = read_line(TRUE);

        /* if we reached end of file, there's no more splicing we can do */
        if (new_line_ofs == -1)
            break;

        /* get a pointer to the new text */
        char *new_line_p = (char *)linebuf_.get_text() + new_line_ofs;
        p.set(new_line_p);

        /* 
         *   If we're in COLLAPSE or DELETE mode for newline spacing, skip
         *   leading spaces in the new line.  However, override this if the
         *   previous line ended with an explicit \n sequence; this tells us
         *   that the line break is explicitly part of the string and that
         *   the subsequent whitespace is to be preserved.
         */
        if (string_newline_spacing_ != NEWLINE_SPACING_PRESERVE
            && !explicit_nl)
            for ( ; is_space(p.getch()) ; p.inc()) ;

        /* check to see if the newly spliced text ends in an explicit \n */
        explicit_nl = (linebuf_.get_text_len() - new_line_ofs >= 2
                       && memcmp(linebuf_.get_text_end() - 2, "\\n", 2) == 0);

        /* if we skipped any spaces, remove them from the text */
        if (p.getptr() > new_line_p)
        {
            /* calculate the length of the rest of the line */
            size_t rem = linebuf_.get_text_len()
                         - (p.getptr() - linebuf_.get_buf());

            /* calculate the new length of the line */
            size_t new_len = (new_line_p - linebuf_.get_buf()) + rem;

            /* move the rest of the line down over the spaces */
            memmove(new_line_p, p.getptr(), rem);

            /* set the new length */
            linebuf_.set_text_len(new_len);
        }

        /* 
         *   If the new line contains only "}" or ";", presume that the
         *   string is unterminated and terminate it here.  (This
         *   heuristic could flag well-formed strings as erroneous, but
         *   users can always work around this by moving these characters
         *   onto lines that contain at least one other non-whitespace
         *   character.)  
         */
        p.set(new_line_p);
        if (p.getch() == '}' || p.getch() == ';')
        {
            /* skip trailing whitespace */
            for (p.inc() ; is_space(p.getch()) ; p.inc()) ;
            
            /* 
             *   if there's nothing else on the line, presume it's an
             *   unterminated string 
             */
            if (p.getch() == '\0')
            {
                /* log the error */
                log_error(TCERR_POSSIBLE_UNTERM_STR,
                          appended_linenum_);

                /* remember that it's unterminated */
                unterm = (char)in_quote;

                /* 
                 *   since we're adding a presumed close quote that never
                 *   appears in the text, we need to figure the new
                 *   in-string status for the line; clear the in-quote
                 *   flag, and re-scan comments from the current point on
                 *   the line 
                 */
                in_quote_ = '\0';
                process_comments(new_line_p - linebuf_.get_buf());

                /* we're done - unsplice from the start of the new line */
                p.set(new_line_p);
                goto done;
            }
        }

        /* scan for the end of the string */
        for (p.set(new_line_p) ; ; p.inc())
        {
            /* get this character */
            wchar_t cur = p.getch();

            /* see what we have */
            if (cur == '\\')
            {
                /* it's a backslash sequence - skip the extra character */
                p.inc();

                /* 
                 *   in a triple-quoted string, a backslash escapes a whole
                 *   run of consecutive quote characters 
                 */
                if (in_triple && p.getch() == in_quote)
                {
                    /* skip all but the last consecutive quote */
                    int qcnt = count_quotes(&p, in_quote);
                    p.inc_by(qcnt - 1);
                }
                else if (p.getch() == '<')
                {
                    /* skip a run of <'s */
                    for ( ; p.getch() == '<' ; p.inc()) ;
                }
            }
            else if (cur == in_quote)
            {
                /* it's our quote character - check for triple quotes */
                if (in_triple)
                {
                    /* in a triple-quoted string - we need 3+ to end it */
                    int qcnt = count_quotes(&p, cur);
                    if (qcnt >= 3)
                    {
                        /* we have at least 3 - skip them and exit */
                        p.inc_by(qcnt);
                        goto done;
                    }
                }
                else
                {
                    /* regular string - skip it and exit the string */
                    p.inc();
                    goto done;
                }
            }
            else if (cur == '<' && p.getch_at(1) == '<')
            {
                /* 
                 *   it's an embedded expression starter - skip the '<<'
                 *   sequence and stop scanning 
                 */
                p.inc();
                p.inc();

                /* check for a '%' sprintf code */
                if (p.getch() == '%')
                    scan_sprintf_spec(&p);

                /* done */
                goto done;
            }
            else if (cur == '\0')
            {
                /* end of line - go back and splice another line */
                break;
            }
        }
    }

done:
    /* if we actually spliced anything, unsplice it at the current point */
    if (p.getptr() != 0)
        unsplice_line(p.getptr());

    /* if we found an unterminated string, supply implicit termination */
    if (unterm != '\0')
        linebuf_.append(&unterm, 1);
}